

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ActionBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ActionBlockSyntax,slang::syntax::StatementSyntax*&,slang::syntax::ElseClauseSyntax*&>
          (BumpAllocator *this,StatementSyntax **args,ElseClauseSyntax **args_1)

{
  StatementSyntax *pSVar1;
  ElseClauseSyntax *pEVar2;
  ActionBlockSyntax *pAVar3;
  
  pAVar3 = (ActionBlockSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ActionBlockSyntax *)this->endPtr < pAVar3 + 1) {
    pAVar3 = (ActionBlockSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pAVar3 + 1);
  }
  pSVar1 = *args;
  pEVar2 = *args_1;
  (pAVar3->super_SyntaxNode).kind = ActionBlock;
  (pAVar3->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pAVar3->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  pAVar3->statement = pSVar1;
  pAVar3->elseClause = pEVar2;
  if (pSVar1 != (StatementSyntax *)0x0) {
    (pSVar1->super_SyntaxNode).parent = &pAVar3->super_SyntaxNode;
  }
  if (pEVar2 != (ElseClauseSyntax *)0x0) {
    (pEVar2->super_SyntaxNode).parent = &pAVar3->super_SyntaxNode;
  }
  return pAVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }